

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O2

bool __thiscall Gluco::Solver::locked(Solver *this,Clause *c)

{
  Ref RVar1;
  bool bVar2;
  int iVar3;
  Clause *pCVar4;
  lbool local_1b;
  lbool local_1a;
  lbool local_19;
  
  if (*(int *)&(c->header).field_0x4 < 3) {
    local_1a.value =
         (byte)*(int *)&c[1].header & 1 ^ (this->assigns).data[*(int *)&c[1].header >> 1].value;
    bVar2 = lbool::operator==(&local_1a,(lbool)0x0);
    if (((bVar2) &&
        (RVar1 = (this->vardata).data[*(int *)&c[1].header >> 1].reason, RVar1 != 0xffffffff)) &&
       (pCVar4 = (Clause *)
                 RegionAllocator<unsigned_int>::lea
                           (&(this->ca).super_RegionAllocator<unsigned_int>,RVar1), pCVar4 == c)) {
      return true;
    }
    iVar3 = *(int *)&c[1].header.field_0x4;
    local_1b.value = (byte)iVar3 & 1 ^ (this->assigns).data[iVar3 >> 1].value;
    bVar2 = lbool::operator==(&local_1b,(lbool)0x0);
    if (!bVar2) {
      return false;
    }
    iVar3 = *(int *)&c[1].header.field_0x4;
  }
  else {
    local_19.value =
         (byte)*(int *)&c[1].header & 1 ^ (this->assigns).data[*(int *)&c[1].header >> 1].value;
    bVar2 = lbool::operator==(&local_19,(lbool)0x0);
    if (!bVar2) {
      return false;
    }
    iVar3 = *(int *)&c[1].header;
  }
  RVar1 = (this->vardata).data[iVar3 >> 1].reason;
  if (RVar1 == 0xffffffff) {
    bVar2 = false;
  }
  else {
    pCVar4 = (Clause *)
             RegionAllocator<unsigned_int>::lea
                       (&(this->ca).super_RegionAllocator<unsigned_int>,RVar1);
    bVar2 = pCVar4 == c;
  }
  return bVar2;
}

Assistant:

inline bool     Solver::locked          (const Clause& c) const { 
   if(c.size()>2) 
     return value(c[0]) == l_True && reason(var(c[0])) != CRef_Undef && ca.lea(reason(var(c[0]))) == &c; 
   return 
     (value(c[0]) == l_True && reason(var(c[0])) != CRef_Undef && ca.lea(reason(var(c[0]))) == &c)
     || 
     (value(c[1]) == l_True && reason(var(c[1])) != CRef_Undef && ca.lea(reason(var(c[1]))) == &c);
 }